

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

DdNode * Llb_ManConstructOutBdd(Aig_Man_t *pAig,Aig_Obj_t *pNode,DdManager *dd)

{
  abctime aVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  DdNode *pDVar8;
  Vec_Ptr_t *p;
  abctime TimeStop;
  Aig_Obj_t *pAStack_50;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  DdNode *bFunc;
  DdNode *bBdd1;
  DdNode *bBdd0;
  DdManager *dd_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *pAig_local;
  
  pAStack_50 = (Aig_Obj_t *)0x0;
  dd_local = (DdManager *)pNode;
  pNode_local = (Aig_Obj_t *)pAig;
  pAVar6 = Aig_ObjFanin0(pNode);
  pAVar7 = Aig_ManConst1((Aig_Man_t *)pNode_local);
  if (pAVar6 == pAVar7) {
    pDVar8 = Cudd_ReadOne(dd);
    iVar4 = Aig_ObjFaninC0((Aig_Obj_t *)dd_local);
    pAig_local = (Aig_Man_t *)((ulong)pDVar8 ^ (long)iVar4);
  }
  else {
    aVar1 = dd->TimeStop;
    dd->TimeStop = 0;
    p = Aig_ManDfsNodes((Aig_Man_t *)pNode_local,(Aig_Obj_t **)&dd_local,1);
    iVar4 = Vec_PtrSize(p);
    if (iVar4 < 1) {
      __assert_fail("Vec_PtrSize(vNodes) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                    ,0x38,"DdNode *Llb_ManConstructOutBdd(Aig_Man_t *, Aig_Obj_t *, DdManager *)");
    }
    for (TimeStop._4_4_ = 0; iVar4 = Vec_PtrSize(p), TimeStop._4_4_ < iVar4;
        TimeStop._4_4_ = TimeStop._4_4_ + 1) {
      pAStack_50 = (Aig_Obj_t *)Vec_PtrEntry(p,TimeStop._4_4_);
      iVar4 = Aig_ObjIsNode(pAStack_50);
      if (iVar4 != 0) {
        pAVar6 = Aig_ObjFanin0(pAStack_50);
        pvVar2 = (pAVar6->field_5).pData;
        iVar4 = Aig_ObjFaninC0(pAStack_50);
        pAVar6 = Aig_ObjFanin1(pAStack_50);
        pvVar3 = (pAVar6->field_5).pData;
        iVar5 = Aig_ObjFaninC1(pAStack_50);
        pDVar8 = Cudd_bddAnd(dd,(DdNode *)((ulong)pvVar2 ^ (long)iVar4),
                             (DdNode *)((ulong)pvVar3 ^ (long)iVar5));
        (pAStack_50->field_5).pData = pDVar8;
        Cudd_Ref((DdNode *)(pAStack_50->field_5).pData);
      }
    }
    vNodes = (Vec_Ptr_t *)(pAStack_50->field_5).pData;
    Cudd_Ref((DdNode *)vNodes);
    for (TimeStop._4_4_ = 0; iVar4 = Vec_PtrSize(p), TimeStop._4_4_ < iVar4;
        TimeStop._4_4_ = TimeStop._4_4_ + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p,TimeStop._4_4_);
      iVar4 = Aig_ObjIsNode(pAVar6);
      if (iVar4 != 0) {
        Cudd_RecursiveDeref(dd,(DdNode *)(pAVar6->field_5).pData);
      }
    }
    Vec_PtrFree(p);
    iVar4 = Aig_ObjIsCo((Aig_Obj_t *)dd_local);
    if (iVar4 != 0) {
      iVar4 = Aig_ObjFaninC0((Aig_Obj_t *)dd_local);
      vNodes = (Vec_Ptr_t *)((ulong)vNodes ^ (long)iVar4);
    }
    Cudd_Deref((DdNode *)vNodes);
    dd->TimeStop = aVar1;
    pAig_local = (Aig_Man_t *)vNodes;
  }
  return (DdNode *)pAig_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START

 
////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives global BDD for the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
DdNode * Llb_ManConstructOutBdd( Aig_Man_t * pAig, Aig_Obj_t * pNode, DdManager * dd )
{
    DdNode * bBdd0, * bBdd1, * bFunc;
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj = NULL;
    int i;
    abctime TimeStop;
    if ( Aig_ObjFanin0(pNode) == Aig_ManConst1(pAig) )
        return Cudd_NotCond( Cudd_ReadOne(dd), Aig_ObjFaninC0(pNode) );
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    vNodes = Aig_ManDfsNodes( pAig, &pNode, 1 );
    assert( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        bBdd0 = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );  Cudd_Ref( (DdNode *)pObj->pData );
    }
    bFunc = (DdNode *)pObj->pData; Cudd_Ref( bFunc );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    }
    Vec_PtrFree( vNodes );
    if ( Aig_ObjIsCo(pNode) )
        bFunc = Cudd_NotCond( bFunc, Aig_ObjFaninC0(pNode) );
    Cudd_Deref( bFunc );
    dd->TimeStop = TimeStop;
    return bFunc;
}